

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O0

int mahjong::basic_form_shanten_specified
              (tile_table_t *cnt_table,tile_t *main_tiles,int main_cnt,intptr_t fixed_cnt,
              useful_table_t *useful_table)

{
  byte bVar1;
  int iVar2;
  int result;
  int n_1;
  tile_t t_1;
  int i_1;
  int n;
  int iStack_cc;
  tile_t t;
  int i;
  int exist_cnt;
  tile_table_t temp_table;
  useful_table_t *useful_table_local;
  intptr_t fixed_cnt_local;
  int main_cnt_local;
  tile_t *main_tiles_local;
  tile_table_t *cnt_table_local;
  
  memcpy(&i,cnt_table,0x90);
  iStack_cc = 0;
  for (n = 0; n < main_cnt; n = n + 1) {
    bVar1 = main_tiles[n];
    if ((*cnt_table)[bVar1] != 0) {
      iStack_cc = iStack_cc + 1;
      *(short *)((long)&i + (ulong)bVar1 * 2) = *(short *)((long)&i + (ulong)bVar1 * 2) + -1;
    }
  }
  if (useful_table != (useful_table_t *)0x0) {
    memset(useful_table,0,0x48);
    for (n_1 = 0; n_1 < main_cnt; n_1 = n_1 + 1) {
      if ((*cnt_table)[main_tiles[n_1]] == 0) {
        (*useful_table)[main_tiles[n_1]] = true;
      }
    }
  }
  iVar2 = basic_form_shanten_from_table((tile_table_t *)&i,fixed_cnt + main_cnt / 3,useful_table);
  return (main_cnt - iStack_cc) + iVar2;
}

Assistant:

static int basic_form_shanten_specified(const tile_table_t &cnt_table, const tile_t *main_tiles, int main_cnt,
    intptr_t fixed_cnt, useful_table_t *useful_table) {

    tile_table_t temp_table;
    memcpy(&temp_table, &cnt_table, sizeof(temp_table));
    int exist_cnt = 0;

    // 统计主番的牌
    for (int i = 0; i < main_cnt; ++i) {
        tile_t t = main_tiles[i];
        int n = cnt_table[t];
        if (n > 0) {  // 有，削减之
            ++exist_cnt;
            --temp_table[t];
        }
    }

    // 记录有效牌
    if (useful_table != nullptr) {
        memset(*useful_table, 0, sizeof(*useful_table));

        // 统计主番缺失的牌
        for (int i = 0; i < main_cnt; ++i) {
            tile_t t = main_tiles[i];
            int n = cnt_table[t];
            if (n <= 0) {
                (*useful_table)[t] = true;
            }
        }
    }

    // 余下牌的上听数
    int result = basic_form_shanten_from_table(temp_table, fixed_cnt + main_cnt / 3, useful_table);

    // 上听数=主番缺少的张数+余下牌的上听数
    return (main_cnt - exist_cnt) + result;
}